

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heritage.cc
# Opt level: O3

void __thiscall
Heritage::splitPieces
          (Heritage *this,vector<Varnode_*,_std::allocator<Varnode_*>_> *vnlist,PcodeOp *insertop,
          Address *addr,int4 size,Varnode *startvn)

{
  uint uVar1;
  iterator iter;
  Varnode *vn;
  Funcdata *this_00;
  bool bVar2;
  Address *pAVar3;
  long lVar4;
  _List_node_base *p_Var5;
  pointer ppVVar6;
  PcodeOp *op;
  uintb uVar7;
  Varnode *vn_00;
  SeqNum *pSVar8;
  ulong uVar9;
  ulong uVar10;
  BlockBasic *local_68;
  Address local_40;
  
  uVar1 = addr->base->flags;
  lVar4 = (long)(int)(-(uVar1 & 1) & size) + addr->offset;
  if (insertop == (PcodeOp *)0x0) {
    local_68 = (BlockBasic *)BlockGraph::getStartBlock(&this->fd->bblocks);
    p_Var5 = (_List_node_base *)&local_68->op;
    pSVar8 = (SeqNum *)&this->fd->baseaddr;
    pAVar3 = &this->fd->baseaddr;
  }
  else {
    local_68 = insertop->parent;
    p_Var5 = (insertop->basiciter)._M_node;
    pSVar8 = &insertop->start;
    pAVar3 = &(insertop->start).pc;
  }
  iter._M_node = p_Var5->_M_next;
  local_40.offset = pAVar3->offset;
  local_40.base = (pSVar8->pc).base;
  ppVVar6 = (vnlist->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((vnlist->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppVVar6) {
    uVar9 = 0;
    uVar10 = 1;
    do {
      vn = ppVVar6[uVar9];
      op = Funcdata::newOp(this->fd,2,&local_40);
      Funcdata::opSetOpcode(this->fd,op,CPUI_SUBPIECE);
      uVar7 = (vn->loc).offset;
      if ((uVar1 & 1) == 0) {
        uVar7 = uVar7 - lVar4;
      }
      else {
        uVar7 = lVar4 - (uVar7 + (long)vn->size);
      }
      Funcdata::opSetInput(this->fd,op,startvn,0);
      this_00 = this->fd;
      vn_00 = Funcdata::newConstant(this_00,4,uVar7);
      Funcdata::opSetInput(this_00,op,vn_00,1);
      Funcdata::opSetOutput(this->fd,op,vn);
      Funcdata::opInsert(this->fd,op,local_68,iter);
      ppVVar6 = (vnlist->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      bVar2 = uVar10 < (ulong)((long)(vnlist->
                                     super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar6 >> 3)
      ;
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

void Heritage::splitPieces(const vector<Varnode *> &vnlist,PcodeOp *insertop,
			   const Address &addr,int4 size,Varnode *startvn)

{
  Address opaddress;
  uintb baseoff;
  bool isbigendian;
  BlockBasic *bl;
  list<PcodeOp *>::iterator insertiter;

  isbigendian = addr.isBigEndian();
  if (isbigendian)
    baseoff = addr.getOffset() + size;
  else
    baseoff = addr.getOffset();
  if (insertop == (PcodeOp *)0) {
    bl = (BlockBasic *)fd->getBasicBlocks().getStartBlock();
    insertiter = bl->beginOp();
    opaddress = fd->getAddress();
  }
  else {
    bl = insertop->getParent();
    insertiter = insertop->getBasicIter();
    ++insertiter;		// Insert AFTER the write
    opaddress = insertop->getAddr();
  }

  for(uint4 i=0;i<vnlist.size();++i) {
    Varnode *vn = vnlist[i];
    PcodeOp *newop = fd->newOp(2,opaddress);
    fd->opSetOpcode(newop,CPUI_SUBPIECE);
    uintb diff;
    if (isbigendian)
      diff = baseoff - (vn->getOffset() + vn->getSize());
    else
      diff = vn->getOffset() - baseoff;
    fd->opSetInput(newop,startvn,0);
    fd->opSetInput(newop,fd->newConstant(4,diff),1);
    fd->opSetOutput(newop,vn);
    fd->opInsert(newop,bl,insertiter);
  }
}